

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

RunResult __thiscall wabt::interp::Thread::PushCall(Thread *this,DefinedFunc *func,Ptr *out_trap)

{
  Store *this_00;
  RunResult RVar1;
  undefined1 local_78 [40];
  unsigned_long local_50;
  RefPtr<wabt::interp::Trap> local_48;
  
  if ((this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      (this->frames_).super__Vector_base<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    this_00 = this->store_;
    local_78._0_8_ = (Module *)(local_78 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"call stack exhausted","");
    Store::
    Alloc<wabt::interp::Trap,wabt::interp::Store&,std::__cxx11::string_const&,std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>const&>
              (&local_48,this_00,this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78,
               &this->frames_);
    out_trap->obj_ = local_48.obj_;
    out_trap->store_ = local_48.store_;
    out_trap->root_index_ = local_48.root_index_;
    local_48.obj_ = (Trap *)0x0;
    local_48.store_ = (Store *)0x0;
    local_48.root_index_ = 0;
    if ((Module *)local_78._0_8_ != (Module *)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
    }
    RVar1 = Trap;
  }
  else {
    RefPtr<wabt::interp::Instance>::RefPtr
              ((RefPtr<wabt::interp::Instance> *)local_78,this->store_,(Ref)(func->instance_).index)
    ;
    this->inst_ = (Instance *)local_78._0_8_;
    if ((Module *)local_78._0_8_ != (Module *)0x0) {
      Store::DeleteRoot((Store *)local_78._8_8_,local_78._16_8_);
      local_78._0_8_ = (Module *)0x0;
      local_78._8_8_ = (Store *)0x0;
      local_78._16_8_ = 0;
    }
    RefPtr<wabt::interp::Module>::RefPtr
              ((RefPtr<wabt::interp::Module> *)local_78,this->store_,
               (Ref)(this->inst_->module_).index);
    this->mod_ = (Module *)local_78._0_8_;
    if ((Module *)local_78._0_8_ != (Module *)0x0) {
      Store::DeleteRoot((Store *)local_78._8_8_,local_78._16_8_);
      local_78._8_8_ = (Store *)0x0;
      local_78._16_8_ = 0;
    }
    local_78._0_8_ = (func->super_Func).super_Extern.super_Object.self_.index;
    local_48.obj_ =
         (Trap *)((long)(this->values_).
                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->values_).
                        super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4);
    local_50 = (long)(this->exceptions_).
                     super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->exceptions_).
                     super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
    std::vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>>::
    emplace_back<wabt::interp::Ref,unsigned_long,unsigned_long,unsigned_int_const&,wabt::interp::Instance*&,wabt::interp::Module*&>
              ((vector<wabt::interp::Frame,std::allocator<wabt::interp::Frame>> *)this,
               (Ref *)local_78,(unsigned_long *)&local_48,&local_50,&(func->desc_).code_offset,
               &this->inst_,&this->mod_);
    RVar1 = Ok;
  }
  return RVar1;
}

Assistant:

RunResult Thread::PushCall(const DefinedFunc& func, Trap::Ptr* out_trap) {
  TRAP_IF(frames_.size() == frames_.capacity(), "call stack exhausted");
  inst_ = store_.UnsafeGet<Instance>(func.instance()).get();
  mod_ = store_.UnsafeGet<Module>(inst_->module()).get();
  frames_.emplace_back(func.self(), values_.size(), exceptions_.size(),
                       func.desc().code_offset, inst_, mod_);
  return RunResult::Ok;
}